

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O1

idx_t duckdb::GetLambdaParamIndex
                (vector<duckdb::DummyBinding,_true> *lambda_bindings,
                BoundLambdaExpression *bound_lambda_expr,
                BoundLambdaRefExpression *bound_lambda_ref_expr)

{
  long lVar1;
  const_reference pvVar2;
  idx_t __n;
  long lVar3;
  
  __n = bound_lambda_ref_expr->lambda_idx;
  lVar3 = 0;
  lVar1 = (long)(lambda_bindings->
                super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(lambda_bindings->
                super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while (__n = __n + 1, __n < (ulong)((lVar1 >> 3) * 0xf83e0f83e0f83e1)) {
    pvVar2 = vector<duckdb::DummyBinding,_true>::operator[](lambda_bindings,__n);
    lVar3 = lVar3 + ((long)(pvVar2->super_Binding).names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar2->super_Binding).names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
    lVar1 = (long)(lambda_bindings->
                  super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                  super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(lambda_bindings->
                  super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                  super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  pvVar2 = vector<duckdb::DummyBinding,_true>::operator[]
                     (lambda_bindings,bound_lambda_ref_expr->lambda_idx);
  return ~(bound_lambda_ref_expr->binding).column_index + lVar3 + bound_lambda_expr->parameter_count
         + ((long)(pvVar2->super_Binding).names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->super_Binding).names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
}

Assistant:

idx_t GetLambdaParamIndex(const vector<DummyBinding> &lambda_bindings, const BoundLambdaExpression &bound_lambda_expr,
                          const BoundLambdaRefExpression &bound_lambda_ref_expr) {
	D_ASSERT(bound_lambda_ref_expr.lambda_idx < lambda_bindings.size());
	idx_t offset = 0;
	// count the remaining lambda parameters BEFORE the current lambda parameter,
	// as these will be in front of the current lambda parameter in the input chunk
	for (idx_t i = bound_lambda_ref_expr.lambda_idx + 1; i < lambda_bindings.size(); i++) {
		offset += lambda_bindings[i].names.size();
	}
	offset +=
	    lambda_bindings[bound_lambda_ref_expr.lambda_idx].names.size() - bound_lambda_ref_expr.binding.column_index - 1;
	offset += bound_lambda_expr.parameter_count;
	return offset;
}